

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void ArrayLiteral_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsVm *pJVar1;
  char *__s;
  bool local_95;
  int local_94;
  int local_90;
  int number;
  int bit;
  int i;
  JsObject *array;
  char *ind;
  JsValue v0;
  JsValue elv;
  JsValue expv;
  JsAstArrayLiteralElement *element;
  JsAstArrayLiteralNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if ((pJVar1->debug == 1) && (pJVar1 = JsGetVm(), pJVar1->trace != (JsVmTraceFn)0x0)) {
    pJVar1 = JsGetVm();
    (*pJVar1->trace)(context->engine,na->location,JS_TRACE_CALL);
  }
  JsFindValue((JsContext *)0x0,"Array",(JsValue *)&ind);
  local_95 = (int)ind == 5 && v0._0_8_ != 0;
  JsAssert((uint)local_95);
  (**(code **)(v0._0_8_ + 0x60))(v0._0_8_,0,0,0,res);
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if ((pJVar1->debug == 1) && (pJVar1 = JsGetVm(), pJVar1->trace != (JsVmTraceFn)0x0)) {
    pJVar1 = JsGetVm();
    (*pJVar1->trace)(context->engine,na->location,JS_TRACE_RETURN);
  }
  ind._0_4_ = 3;
  v0._0_8_ = (BADTYPE)(int)na[1].astClass;
  (*((res->u).object)->Put)((JsObject *)(res->u).number,"length",(JsValue *)&ind,0);
  number = 0;
  for (expv.u.reference.name = (char *)na[1].location; expv.u.reference.name != (char *)0x0;
      expv.u._8_8_ = expv.u.reference.name[0x10]) {
    (*JsNodeClassEval[**(uint **)(expv.u.reference.name + 8)])
              (*(JsAstNode **)(expv.u.reference.name + 8),context,(JsValue *)((long)&elv.u + 8));
    JsGetValue((JsValue *)((long)&elv.u + 8),(JsValue *)((long)&v0.u + 8));
    local_90 = 0;
    for (local_94 = number; local_94 != 0; local_94 = local_94 / 10) {
      local_90 = local_90 + 1;
    }
    __s = (char *)JsMalloc(local_90 + 4);
    sprintf(__s,"%d",(ulong)(uint)number);
    (*((res->u).object)->Put)((JsObject *)(res->u).number,__s,(JsValue *)((long)&v0.u + 8),0);
    number = number + 1;
  }
  return;
}

Assistant:

static void
ArrayLiteral_eval(na, context, res)
	struct JsAstNode *na; /* (struct ArrayLiteral_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstArrayLiteralNode *n = CAST_NODE(na, JsAstArrayLiteralNode);
	struct JsAstArrayLiteralElement *element;
	struct JsValue expv, elv, v0;
	char *ind;
	struct JsObject* array;

	TRACE(na->location, context, JS_TRACE_CALL);
	//查询Array对象
	JsFindValue(NULL,"Array",&v0);
	//确定Array正确
	JsAssert(v0.type == JS_OBJECT && v0.u.object != NULL);
	array = v0.u.object;
	//构建空的Array
	(*array->Construct)(array,NULL,0,NULL,res);
	TRACE(na->location, context, JS_TRACE_RETURN);
	//配置length
	v0.type = JS_NUMBER;
	v0.u.number =  n->length;
	(*res->u.object->Put)(res->u.object,"length",&v0,JS_OBJECT_ATTR_DEFAULT);
	//加入数组元素
	int i;
	for (i=0,element = n->first; element; element = element->next , i++) {
		EVAL(element->expr, context, &expv);
		JsGetValue( &expv, &elv);
		//创建index string
		int bit = 0;
		int number = i;
		while(number){
			number /= 10;
			bit++;
		}
		ind = (char*)JsMalloc(bit+4);
		sprintf(ind,"%d",i);
		//添加到Array中
		(*res->u.object->Put)(res->u.object,ind,&elv,JS_OBJECT_ATTR_DEFAULT);
	}
}